

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CConstructSymbolTableVisitor.cpp
# Opt level: O0

void __thiscall
CConstructSymbolTableVisitor::Visit(CConstructSymbolTableVisitor *this,CAssignStm *stm)

{
  bool bVar1;
  pointer pCVar2;
  pointer pIVar3;
  CAssignStm *stm_local;
  CConstructSymbolTableVisitor *this_local;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&stm->leftExpression);
  if (bVar1) {
    pCVar2 = std::unique_ptr<CIdExp,_std::default_delete<CIdExp>_>::operator->(&stm->leftExpression)
    ;
    (**(pCVar2->super_IExpression).super_PositionedNode.super_INode._vptr_INode)(pCVar2,this);
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&stm->rightExpression);
  if (bVar1) {
    pIVar3 = std::unique_ptr<IExpression,_std::default_delete<IExpression>_>::operator->
                       (&stm->rightExpression);
    (**(pIVar3->super_PositionedNode).super_INode._vptr_INode)(pIVar3,this);
  }
  return;
}

Assistant:

void CConstructSymbolTableVisitor::Visit( CAssignStm &stm )
{
	if( stm.leftExpression ) {
		stm.leftExpression->Accept( *this );
	}
	if( stm.rightExpression ) {
		stm.rightExpression->Accept( *this );
	}
}